

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseInstrList(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  Expr *pEVar4;
  TokenType TVar5;
  TokenType TVar6;
  Result RVar7;
  Enum EVar8;
  iterator pos;
  ExprList new_exprs;
  _Head_base<0UL,_wabt::Expr_*,_false> local_50;
  ExprList local_48;
  
  local_48.first_ = (Expr *)0x0;
  local_48.last_ = (Expr *)0x0;
  local_48.size_ = 0;
  do {
    TVar5 = Peek(this,0);
    TVar6 = Peek(this,1);
    if ((0x3d < TVar5 - AtomicLoad) ||
       ((0x3fff7effff9fbfffU >> ((ulong)(TVar5 - AtomicLoad) & 0x3f) & 1) == 0)) {
      pEVar4 = local_48.first_;
      if ((TVar5 != Lpar) || (0x3d < TVar6 - AtomicLoad)) {
        EVar8 = Ok;
        goto joined_r0x002322f7;
      }
      EVar8 = Ok;
      if ((0x3fff7effff9fbfffU >> ((ulong)(TVar6 - AtomicLoad) & 0x3f) & 1) == 0)
      goto joined_r0x002322f7;
    }
    RVar7 = ParseInstr(this,&local_48);
    pEVar4 = local_48.first_;
    if (RVar7.enum_ == Ok) {
      while (pEVar4 != (Expr *)0x0) {
        if (local_48.size_ == 0) {
          __assert_fail("!empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                        ,0x223,
                        "std::unique_ptr<T> wabt::intrusive_list<wabt::Expr>::extract(iterator) [T = wabt::Expr]"
                       );
        }
        pEVar3 = (pEVar4->super_intrusive_list_base<wabt::Expr>).next_;
        if (local_48.first_ == local_48.last_) {
          local_48.first_ = (Expr *)0x0;
          local_48.last_ = (Expr *)0x0;
          pEVar1 = local_48.last_;
        }
        else {
          pEVar1 = (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_;
          pEVar2 = pEVar3;
          if (pEVar1 != (Expr *)0x0) {
            (pEVar1->super_intrusive_list_base<wabt::Expr>).next_ = pEVar3;
            pEVar2 = local_48.first_;
          }
          local_48.first_ = pEVar2;
          pEVar2 = (pEVar4->super_intrusive_list_base<wabt::Expr>).next_;
          if (pEVar2 != (Expr *)0x0) {
            (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
            pEVar1 = local_48.last_;
          }
        }
        local_48.last_ = pEVar1;
        local_48.size_ = local_48.size_ - 1;
        (pEVar4->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
        (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
        pos.node_ = (Expr *)0x0;
        pos.list_ = exprs;
        local_50._M_head_impl = pEVar4;
        intrusive_list<wabt::Expr>::insert
                  (exprs,pos,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_50);
        if (local_50._M_head_impl != (Expr *)0x0) {
          (*(local_50._M_head_impl)->_vptr_Expr[1])();
        }
        local_50._M_head_impl = (Expr *)0x0;
        pEVar4 = pEVar3;
      }
    }
    else {
      RVar7 = Synchronize(this,anon_unknown_1::IsInstr);
      if (RVar7.enum_ == Error) {
        EVar8 = Error;
        pEVar4 = local_48.first_;
joined_r0x002322f7:
        while (pEVar4 != (Expr *)0x0) {
          pEVar3 = (pEVar4->super_intrusive_list_base<wabt::Expr>).next_;
          (*pEVar4->_vptr_Expr[1])();
          pEVar4 = pEVar3;
        }
        return (Result)EVar8;
      }
    }
  } while( true );
}

Assistant:

Result WastParser::ParseInstrList(ExprList* exprs) {
  WABT_TRACE(ParseInstrList);
  ExprList new_exprs;
  while (IsInstr(PeekPair())) {
    if (Succeeded(ParseInstr(&new_exprs))) {
      exprs->splice(exprs->end(), new_exprs);
    } else {
      CHECK_RESULT(Synchronize(IsInstr));
    }
  }
  return Result::Ok;
}